

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O2

void deqp::ub::anon_unknown_1::computeStd140Layout
               (UniformLayout *layout,int *curOffset,int curBlockNdx,string *curPrefix,VarType *type
               ,deUint32 layoutFlags)

{
  VarType *pVVar1;
  int iVar2;
  int iVar3;
  DataType DVar4;
  uint uVar5;
  int iVar6;
  StructType *pSVar7;
  DataType elemBasicType;
  pointer pSVar8;
  UniformLayoutEntry entry;
  int local_dc;
  ulong local_d8;
  value_type local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = computeStd140BaseAlignment(type);
  *curOffset = *curOffset + iVar2 + -1 & -iVar2;
  if (type->m_type == TYPE_ARRAY) {
    pVVar1 = (type->m_data).array.elementType;
    if (pVVar1->m_type != TYPE_BASIC) {
      for (local_dc = 0; local_dc < (type->m_data).array.size; local_dc = local_dc + 1) {
        std::operator+(&local_50,curPrefix,"[");
        de::toString<int>(&local_70,&local_dc);
        std::operator+(&local_90,&local_50,&local_70);
        std::operator+(&local_d0.name,&local_90,"]");
        computeStd140Layout(layout,curOffset,curBlockNdx,&local_d0.name,
                            (type->m_data).array.elementType,layoutFlags);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
      return;
    }
    DVar4 = (pVVar1->m_data).basicType;
    if (DVar4 - TYPE_DOUBLE_MAT2 < 9 || DVar4 - TYPE_FLOAT_MAT2 < 9) {
      local_d8 = (ulong)DVar4;
      if ((layoutFlags & 0x40) == 0) {
        iVar2 = glu::getDataTypeMatrixNumRows(DVar4);
        iVar3 = glu::getDataTypeMatrixNumColumns(DVar4);
      }
      else {
        iVar2 = glu::getDataTypeMatrixNumColumns(DVar4);
        iVar3 = glu::getDataTypeMatrixNumRows(DVar4);
      }
      DVar4 = glu::getDataTypeFloatVec(iVar2);
      iVar6 = getDataTypeArrayStride(DVar4);
      local_d0.name._M_dataplus._M_p = (pointer)&local_d0.name.field_2;
      local_d0.name._M_string_length = 0;
      local_d0.name.field_2._M_local_buf[0] = '\0';
      local_d0.type = TYPE_LAST;
      local_d0.size = 0;
      local_d0.blockNdx = -1;
      local_d0.offset = -1;
      local_d0.arrayStride = -1;
      local_d0.matrixStride = -1;
      local_d0.isRowMajor = false;
      std::operator+(&local_90,curPrefix,"[0]");
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      local_d0.offset = *curOffset;
      iVar2 = (type->m_data).array.size;
      local_d0.size = iVar2;
      local_d0.type = (DataType)local_d8;
      local_d0.matrixStride = iVar6;
      local_d0.arrayStride = iVar3 * iVar6;
      local_d0.isRowMajor = SUB41((layoutFlags & 0x40) >> 6,0);
      *curOffset = iVar3 * iVar6 * iVar2 + local_d0.offset;
      local_d0.blockNdx = curBlockNdx;
      std::vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::
      push_back(&layout->uniforms,&local_d0);
    }
    else {
      local_d0.name._M_dataplus._M_p = (pointer)&local_d0.name.field_2;
      local_d0.name._M_string_length = 0;
      local_d0.name.field_2._M_local_buf[0] = '\0';
      local_d0.type = TYPE_LAST;
      local_d0.size = 0;
      local_d0.blockNdx = -1;
      local_d0.offset = -1;
      local_d0.arrayStride = -1;
      local_d0.matrixStride = -1;
      local_d0.isRowMajor = false;
      uVar5 = getDataTypeArrayStride(DVar4);
      std::operator+(&local_90,curPrefix,"[0]");
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      local_d0.offset = *curOffset;
      local_d0.size = (type->m_data).array.size;
      local_d0.type = DVar4;
      local_d0.matrixStride = 0;
      local_d0.arrayStride = uVar5;
      *curOffset = local_d0.size * uVar5 + local_d0.offset;
      local_d0.blockNdx = curBlockNdx;
      std::vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::
      push_back(&layout->uniforms,&local_d0);
    }
  }
  else {
    if (type->m_type != TYPE_BASIC) {
      pSVar7 = (type->m_data).structPtr;
      local_d8 = (ulong)(uint)-iVar2;
      for (pSVar8 = (pSVar7->m_members).
                    super__Vector_base<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar8 != (pSVar7->m_members).
                    super__Vector_base<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pSVar8 = pSVar8 + 1) {
        std::operator+(&local_90,curPrefix,".");
        std::operator+(&local_d0.name,&local_90,(pSVar8->m_name)._M_dataplus._M_p);
        computeStd140Layout(layout,curOffset,curBlockNdx,&local_d0.name,&pSVar8->m_type,layoutFlags)
        ;
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_90);
        pSVar7 = (type->m_data).structPtr;
      }
      *curOffset = iVar2 + -1 + *curOffset & (uint)local_d8;
      return;
    }
    DVar4 = (type->m_data).basicType;
    local_d0.name._M_dataplus._M_p = (pointer)&local_d0.name.field_2;
    local_d0.name._M_string_length = 0;
    local_d0.name.field_2._M_local_buf[0] = '\0';
    local_d0.type = TYPE_LAST;
    local_d0.size = 0;
    local_d0.blockNdx = -1;
    local_d0.offset = -1;
    local_d0.arrayStride = -1;
    local_d0.matrixStride = -1;
    local_d0.isRowMajor = false;
    std::__cxx11::string::_M_assign((string *)&local_d0);
    local_d0.size = 1;
    local_d0.type = DVar4;
    local_d0.arrayStride = 0;
    local_d0.matrixStride = 0;
    if (DVar4 - TYPE_FLOAT_MAT2 < 9 || DVar4 - TYPE_DOUBLE_MAT2 < 9) {
      if ((layoutFlags & 0x40) == 0) {
        local_d0.blockNdx = curBlockNdx;
        iVar2 = glu::getDataTypeMatrixNumRows(DVar4);
        iVar3 = glu::getDataTypeMatrixNumColumns(DVar4);
      }
      else {
        local_d0.blockNdx = curBlockNdx;
        iVar2 = glu::getDataTypeMatrixNumColumns(DVar4);
        iVar3 = glu::getDataTypeMatrixNumRows(DVar4);
      }
      DVar4 = glu::getDataTypeFloatVec(iVar2);
      iVar2 = getDataTypeArrayStride(DVar4);
      local_d0.offset = *curOffset;
      local_d0.matrixStride = iVar2;
      local_d0.isRowMajor = SUB41((layoutFlags & 0x40) >> 6,0);
      iVar2 = iVar3 * iVar2 + local_d0.offset;
    }
    else {
      local_d0.offset = *curOffset;
      local_d0.blockNdx = curBlockNdx;
      iVar2 = getDataTypeByteSize(DVar4);
      iVar2 = iVar2 + *curOffset;
    }
    *curOffset = iVar2;
    std::vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::
    push_back(&layout->uniforms,&local_d0);
  }
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

void computeStd140Layout(UniformLayout& layout, int& curOffset, int curBlockNdx, const std::string& curPrefix,
						 const VarType& type, deUint32 layoutFlags)
{
	int baseAlignment = computeStd140BaseAlignment(type);

	curOffset = deAlign32(curOffset, baseAlignment);

	if (type.isBasicType())
	{
		glu::DataType	  basicType = type.getBasicType();
		UniformLayoutEntry entry;

		entry.name		   = curPrefix;
		entry.type		   = basicType;
		entry.size		   = 1;
		entry.arrayStride  = 0;
		entry.matrixStride = 0;
		entry.blockNdx	 = curBlockNdx;

		if (glu::isDataTypeMatrix(basicType))
		{
			// Array of vectors as specified in rules 5 & 7.
			bool isRowMajor = !!(layoutFlags & LAYOUT_ROW_MAJOR);
			int  vecSize =
				isRowMajor ? glu::getDataTypeMatrixNumColumns(basicType) : glu::getDataTypeMatrixNumRows(basicType);
			int numVecs =
				isRowMajor ? glu::getDataTypeMatrixNumRows(basicType) : glu::getDataTypeMatrixNumColumns(basicType);
			int stride = getDataTypeArrayStride(glu::getDataTypeFloatVec(vecSize));

			entry.offset	   = curOffset;
			entry.matrixStride = stride;
			entry.isRowMajor   = isRowMajor;

			curOffset += numVecs * stride;
		}
		else
		{
			// Scalar or vector.
			entry.offset = curOffset;

			curOffset += getDataTypeByteSize(basicType);
		}

		layout.uniforms.push_back(entry);
	}
	else if (type.isArrayType())
	{
		const VarType& elemType = type.getElementType();

		if (elemType.isBasicType() && !glu::isDataTypeMatrix(elemType.getBasicType()))
		{
			// Array of scalars or vectors.
			glu::DataType	  elemBasicType = elemType.getBasicType();
			UniformLayoutEntry entry;
			int				   stride = getDataTypeArrayStride(elemBasicType);

			entry.name		   = curPrefix + "[0]"; // Array uniforms are always postfixed with [0]
			entry.type		   = elemBasicType;
			entry.blockNdx	 = curBlockNdx;
			entry.offset	   = curOffset;
			entry.size		   = type.getArraySize();
			entry.arrayStride  = stride;
			entry.matrixStride = 0;

			curOffset += stride * type.getArraySize();

			layout.uniforms.push_back(entry);
		}
		else if (elemType.isBasicType() && glu::isDataTypeMatrix(elemType.getBasicType()))
		{
			// Array of matrices.
			glu::DataType elemBasicType = elemType.getBasicType();
			bool		  isRowMajor	= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			int			  vecSize		= isRowMajor ? glu::getDataTypeMatrixNumColumns(elemBasicType) :
									   glu::getDataTypeMatrixNumRows(elemBasicType);
			int numVecs = isRowMajor ? glu::getDataTypeMatrixNumRows(elemBasicType) :
									   glu::getDataTypeMatrixNumColumns(elemBasicType);
			int				   stride = getDataTypeArrayStride(glu::getDataTypeFloatVec(vecSize));
			UniformLayoutEntry entry;

			entry.name		   = curPrefix + "[0]"; // Array uniforms are always postfixed with [0]
			entry.type		   = elemBasicType;
			entry.blockNdx	 = curBlockNdx;
			entry.offset	   = curOffset;
			entry.size		   = type.getArraySize();
			entry.arrayStride  = stride * numVecs;
			entry.matrixStride = stride;
			entry.isRowMajor   = isRowMajor;

			curOffset += numVecs * type.getArraySize() * stride;

			layout.uniforms.push_back(entry);
		}
		else
		{
			DE_ASSERT(elemType.isStructType() || elemType.isArrayType());

			for (int elemNdx = 0; elemNdx < type.getArraySize(); elemNdx++)
				computeStd140Layout(layout, curOffset, curBlockNdx, curPrefix + "[" + de::toString(elemNdx) + "]",
									type.getElementType(), layoutFlags);
		}
	}
	else
	{
		DE_ASSERT(type.isStructType());

		for (StructType::ConstIterator memberIter = type.getStruct().begin(); memberIter != type.getStruct().end();
			 memberIter++)
			computeStd140Layout(layout, curOffset, curBlockNdx, curPrefix + "." + memberIter->getName(),
								memberIter->getType(), layoutFlags);

		curOffset = deAlign32(curOffset, baseAlignment);
	}
}